

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

bool slang::ast::AssertionExpr::checkAssertionCall
               (CallExpression *call,ASTContext *context,DiagCode outArgCode,DiagCode refArgCode,
               DiagCode nonVoidCode,SourceRange range,bool isInsideSequence)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  bool bVar1;
  SubroutineKind SVar2;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar3;
  reference ppFVar4;
  Symbol *pSVar5;
  VariableSymbol *pVVar6;
  reference ppEVar7;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_R8D;
  byte in_R9B;
  Diagnostic *diag_1;
  Symbol *sym;
  Diagnostic *diag;
  FormalArgumentSymbol **formal;
  iterator __end3;
  iterator __begin3;
  ArgList *__range3;
  size_t index;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> args;
  SubroutineSymbol *sub_1;
  SystemSubroutine *sub;
  SubroutineSymbol *in_stack_fffffffffffffea8;
  Diagnostic *in_stack_fffffffffffffeb0;
  SourceLocation noteLocation;
  CallExpression *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  SourceLocation in_stack_fffffffffffffed0;
  SourceLocation in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  DiagCode DVar8;
  Diagnostic *in_stack_fffffffffffffef0;
  SourceLocation this;
  Expression *in_stack_fffffffffffffef8;
  SourceLocation SVar9;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  local_a8;
  ArgList local_a0;
  ArgList *local_90;
  size_type local_88;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_80;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> local_70;
  undefined8 local_68;
  Type *local_60;
  undefined4 local_54;
  SystemSubroutine *local_50;
  string_view local_48;
  undefined8 local_38;
  Type *local_30;
  undefined4 local_26;
  byte local_21;
  undefined4 local_e;
  undefined4 local_a;
  undefined4 local_6;
  
  noteLocation = (SourceLocation)&stack0x00000008;
  local_21 = in_R9B & 1;
  local_e = in_R8D;
  local_a = in_ECX;
  local_6 = in_EDX;
  if (((local_21 != 0) || (bVar1 = CallExpression::isSystemCall((CallExpression *)0x94941d), bVar1))
     && (SVar2 = CallExpression::getSubroutineKind((CallExpression *)noteLocation),
        SVar2 == Function)) {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x94944d);
    bVar1 = Type::isVoid((Type *)0x949455);
    if (!bVar1) {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x94946e)
      ;
      bVar1 = Type::isError((Type *)0x949476);
      if (!bVar1) {
        local_26 = local_e;
        local_38 = *(undefined8 *)noteLocation;
        local_30 = ((not_null<const_slang::ast::Type_*> *)((long)noteLocation + 8))->ptr;
        sourceRange.endLoc = in_stack_fffffffffffffed8;
        sourceRange.startLoc = in_stack_fffffffffffffed0;
        in_stack_fffffffffffffeb0 =
             ASTContext::addDiag((ASTContext *)
                                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                                 SUB84((ulong)in_stack_fffffffffffffee0 >> 0x20,0),sourceRange);
        local_48 = CallExpression::getSubroutineName(in_stack_fffffffffffffec0);
        arg._M_str._0_4_ = in_stack_ffffffffffffff00;
        arg._M_len = (size_t)in_stack_fffffffffffffef8;
        arg._M_str._4_4_ = in_stack_ffffffffffffff04;
        Diagnostic::operator<<(in_stack_fffffffffffffef0,arg);
      }
    }
  }
  bVar1 = CallExpression::isSystemCall((CallExpression *)0x949517);
  DVar8 = SUB84((ulong)in_stack_fffffffffffffee0 >> 0x20,0);
  if (bVar1) {
    std::get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
              ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                *)0x949531);
    local_50 = not_null<const_slang::ast::SystemSubroutine_*>::operator*
                         ((not_null<const_slang::ast::SystemSubroutine_*> *)0x949539);
    if ((local_50->hasOutputArgs & 1U) != 0) {
      local_54 = local_6;
      local_68 = *(undefined8 *)noteLocation;
      local_60 = ((not_null<const_slang::ast::Type_*> *)((long)noteLocation + 8))->ptr;
      sourceRange_00.endLoc = in_stack_fffffffffffffed8;
      sourceRange_00.startLoc = in_stack_fffffffffffffed0;
      ASTContext::addDiag((ASTContext *)
                          CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),DVar8,
                          sourceRange_00);
      return false;
    }
  }
  else {
    ppSVar3 = std::
              get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                        ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          *)0x9495c0);
    local_70 = *ppSVar3;
    local_80 = CallExpression::arguments((CallExpression *)0x9495d8);
    local_88 = 0;
    local_a0 = SubroutineSymbol::getArguments(in_stack_fffffffffffffea8);
    local_90 = &local_a0;
    local_a8._M_current =
         (FormalArgumentSymbol **)
         std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                    in_stack_fffffffffffffea8);
    std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::end
              ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
               noteLocation);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffeb0,
                              (__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffea8), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppFVar4 = __gnu_cxx::
                __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                ::operator*(&local_a8);
      DVar8 = SUB84((ulong)in_stack_fffffffffffffec0 >> 0x20,0);
      if (((*ppFVar4)->direction == Out) || ((*ppFVar4)->direction == InOut)) {
        sourceRange_01.endLoc = in_stack_fffffffffffffed8;
        sourceRange_01.startLoc = in_stack_fffffffffffffed0;
        ASTContext::addDiag((ASTContext *)
                            CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                            SUB84((ulong)in_stack_fffffffffffffee0 >> 0x20,0),sourceRange_01);
        Diagnostic::addNote(in_stack_fffffffffffffeb0,DVar8,noteLocation);
        return false;
      }
      if ((*ppFVar4)->direction == Ref) {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                  (&local_80,local_88);
        pSVar5 = Expression::getSymbolReference
                           (in_stack_fffffffffffffef8,
                            SUB81((ulong)in_stack_fffffffffffffef0 >> 0x38,0));
        if ((pSVar5 != (Symbol *)0x0) && (bVar1 = VariableSymbol::isKind(pSVar5->kind), bVar1)) {
          pVVar6 = Symbol::as<slang::ast::VariableSymbol>((Symbol *)0x9497b1);
          DVar8 = SUB84((ulong)in_stack_fffffffffffffee0 >> 0x20,0);
          if (pVVar6->lifetime == Automatic) {
            ppEVar7 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
                      operator[](&local_80,local_88);
            this = ((*ppEVar7)->sourceRange).startLoc;
            SVar9 = ((*ppEVar7)->sourceRange).endLoc;
            sourceRange_02.endLoc = in_stack_fffffffffffffed8;
            sourceRange_02.startLoc = in_stack_fffffffffffffed0;
            ASTContext::addDiag((ASTContext *)
                                CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),DVar8,
                                sourceRange_02);
            arg_00._M_str._0_4_ = in_stack_ffffffffffffff00;
            arg_00._M_len = (size_t)SVar9;
            arg_00._M_str._4_4_ = local_a;
            Diagnostic::operator<<((Diagnostic *)this,arg_00);
            arg_01._M_str._0_4_ = in_stack_ffffffffffffff00;
            arg_01._M_len = (size_t)SVar9;
            arg_01._M_str._4_4_ = local_a;
            Diagnostic::operator<<((Diagnostic *)this,arg_01);
            Diagnostic::addNote(in_stack_fffffffffffffeb0,SUB84(pSVar5->location,4),noteLocation);
            return false;
          }
        }
      }
      local_88 = local_88 + 1;
      __gnu_cxx::
      __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
      ::operator++(&local_a8);
    }
  }
  return true;
}

Assistant:

bool AssertionExpr::checkAssertionCall(const CallExpression& call, const ASTContext& context,
                                       DiagCode outArgCode, DiagCode refArgCode,
                                       DiagCode nonVoidCode, SourceRange range,
                                       bool isInsideSequence) {
    if (isInsideSequence || call.isSystemCall()) {
        if (call.getSubroutineKind() == SubroutineKind::Function && !call.type->isVoid() &&
            !call.type->isError()) {
            context.addDiag(nonVoidCode, range) << call.getSubroutineName();
        }
    }

    if (call.isSystemCall()) {
        auto& sub = *std::get<1>(call.subroutine).subroutine;
        if (sub.hasOutputArgs) {
            context.addDiag(outArgCode, range);
            return false;
        }
    }
    else {
        auto& sub = *std::get<0>(call.subroutine);
        auto args = call.arguments();
        size_t index = 0;
        for (auto& formal : sub.getArguments()) {
            if (formal->direction == ArgumentDirection::Out ||
                formal->direction == ArgumentDirection::InOut) {
                auto& diag = context.addDiag(outArgCode, range);
                diag.addNote(diag::NoteDeclarationHere, formal->location);
                return false;
            }

            if (formal->direction == ArgumentDirection::Ref) {
                SLANG_ASSERT(index < args.size());
                if (auto sym = args[index]->getSymbolReference()) {
                    if (VariableSymbol::isKind(sym->kind) &&
                        sym->as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {
                        auto& diag = context.addDiag(refArgCode, args[index]->sourceRange);
                        diag << sym->name << formal->name;
                        diag.addNote(diag::NoteDeclarationHere, sym->location);
                        return false;
                    }
                }
            }

            index++;
        }
    }

    return true;
}